

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall
icu_63::RangeDescriptor::RangeDescriptor
          (RangeDescriptor *this,RangeDescriptor *other,UErrorCode *status)

{
  UErrorCode code;
  UBool UVar1;
  int32_t iVar2;
  UVector *pUVar3;
  void *obj;
  UVector *local_48;
  int local_24;
  UErrorCode oldstatus;
  int i;
  UErrorCode *status_local;
  RangeDescriptor *other_local;
  RangeDescriptor *this_local;
  
  this->fStartChar = other->fStartChar;
  this->fEndChar = other->fEndChar;
  this->fNum = other->fNum;
  this->fNext = (RangeDescriptor *)0x0;
  code = *status;
  pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)other);
  local_48 = (UVector *)0x0;
  if (pUVar3 != (UVector *)0x0) {
    UVector::UVector(pUVar3,status);
    local_48 = pUVar3;
  }
  this->fIncludesSets = local_48;
  UVar1 = ::U_FAILURE(code);
  if (UVar1 != '\0') {
    *status = code;
  }
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fIncludesSets == (UVector *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      for (local_24 = 0; iVar2 = UVector::size(other->fIncludesSets), local_24 < iVar2;
          local_24 = local_24 + 1) {
        pUVar3 = this->fIncludesSets;
        obj = UVector::elementAt(other->fIncludesSets,local_24);
        UVector::addElement(pUVar3,obj,status);
      }
    }
  }
  return;
}

Assistant:

RangeDescriptor::RangeDescriptor(const RangeDescriptor &other, UErrorCode &status) {
    int  i;

    this->fStartChar    = other.fStartChar;
    this->fEndChar      = other.fEndChar;
    this->fNum          = other.fNum;
    this->fNext         = NULL;
    UErrorCode oldstatus = status;
    this->fIncludesSets = new UVector(status);
    if (U_FAILURE(oldstatus)) {
        status = oldstatus;
    }
    if (U_FAILURE(status)) {
        return;
    }
    /* test for NULL */
    if (this->fIncludesSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    for (i=0; i<other.fIncludesSets->size(); i++) {
        this->fIncludesSets->addElement(other.fIncludesSets->elementAt(i), status);
    }
}